

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

size_t google::protobuf::internal::WireFormat::FieldDataOnlyByteSize
                 (FieldDescriptor *field,Message *message)

{
  FieldDescriptor *field_00;
  long lVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  Type TVar5;
  int32 iVar6;
  uint32 uVar7;
  MapFieldBase *this;
  Descriptor *pDVar8;
  size_t sVar9;
  size_t sVar10;
  string *value;
  undefined4 extraout_var;
  uint64 uVar11;
  EnumValueDescriptor *pEVar12;
  int64 iVar13;
  size_t sVar14;
  Message *pMVar15;
  undefined4 extraout_var_00;
  ulong uVar16;
  Reflection *this_00;
  size_t sVar17;
  int j;
  MapIterator iter;
  MapIterator end;
  
  (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
  bVar2 = FieldDescriptor::is_map(field);
  if (bVar2) {
    this = Reflection::GetMapData(this_00,message,field);
    bVar2 = MapFieldBase::IsMapValid(this);
    if (bVar2) {
      MapIterator::MapIterator(&iter,message,field);
      MapIterator::MapIterator(&end,message,field);
      pDVar8 = FieldDescriptor::message_type(field);
      field_00 = *(FieldDescriptor **)(pDVar8 + 0x28);
      pDVar8 = FieldDescriptor::message_type(field);
      lVar1 = *(long *)(pDVar8 + 0x28);
      (*this->_vptr_MapFieldBase[6])(this,&iter);
      (*this->_vptr_MapFieldBase[7])(this,&end);
      sVar17 = 0;
      while (iVar3 = (*(iter.map_)->_vptr_MapFieldBase[5])(iter.map_,&iter,&end),
            (char)iVar3 == '\0') {
        sVar9 = MapKeyDataOnlyByteSize(field_00,&iter.key_);
        sVar10 = MapValueRefDataOnlyByteSize((FieldDescriptor *)(lVar1 + 0x98),&iter.value_);
        uVar4 = (int)sVar10 + (int)sVar9 + 2U | 1;
        iVar3 = 0x1f;
        if (uVar4 != 0) {
          for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        sVar17 = sVar17 + sVar10 + sVar9 + 2 + (ulong)(iVar3 * 9 + 0x49U >> 6);
        (*(iter.map_)->_vptr_MapFieldBase[0x12])(iter.map_,&iter);
      }
      MapIterator::~MapIterator(&end);
      MapIterator::~MapIterator(&iter);
      return sVar17;
    }
  }
  if (*(int *)(field + 0x3c) == 3) {
    uVar4 = Reflection::FieldSize(this_00,message,field);
    sVar17 = (size_t)uVar4;
  }
  else if (*(char *)(*(long *)(*(long *)(field + 0x50) + 0x20) + 0x4b) == '\0') {
    bVar2 = Reflection::HasField(this_00,message,field);
    sVar17 = (size_t)bVar2;
  }
  else {
    sVar17 = 1;
  }
  TVar5 = FieldDescriptor::type(field);
  sVar9 = sVar17;
  switch(TVar5) {
  case TYPE_DOUBLE:
  case TYPE_FIXED64:
  case TYPE_SFIXED64:
    sVar9 = sVar17 << 3;
    break;
  case TYPE_FLOAT:
  case TYPE_FIXED32:
  case TYPE_SFIXED32:
    sVar9 = sVar17 << 2;
    break;
  case TYPE_INT64:
    if (*(int *)(field + 0x3c) == 3) {
      sVar9 = 0;
      for (sVar10 = 0; sVar17 != sVar10; sVar10 = sVar10 + 1) {
        uVar16 = Reflection::GetRepeatedInt64(this_00,message,field,(int)sVar10);
        lVar1 = 0x3f;
        if ((uVar16 | 1) != 0) {
          for (; (uVar16 | 1) >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        sVar9 = sVar9 + ((int)lVar1 * 9 + 0x49U >> 6);
      }
      return sVar9;
    }
    uVar16 = Reflection::GetInt64(this_00,message,field);
    goto LAB_0027b1eb;
  case TYPE_UINT64:
    if (*(int *)(field + 0x3c) == 3) {
      sVar9 = 0;
      for (sVar10 = 0; sVar17 != sVar10; sVar10 = sVar10 + 1) {
        uVar11 = Reflection::GetRepeatedUInt64(this_00,message,field,(int)sVar10);
        lVar1 = 0x3f;
        if ((uVar11 | 1) != 0) {
          for (; (uVar11 | 1) >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        sVar9 = sVar9 + ((int)lVar1 * 9 + 0x49U >> 6);
      }
      return sVar9;
    }
    uVar16 = Reflection::GetUInt64(this_00,message,field);
LAB_0027b1eb:
    lVar1 = 0x3f;
    if ((uVar16 | 1) != 0) {
      for (; (uVar16 | 1) >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    iVar3 = (int)lVar1;
LAB_0027b1f3:
    sVar9 = (size_t)(iVar3 * 9 + 0x49U >> 6);
    break;
  case TYPE_INT32:
    if (*(int *)(field + 0x3c) != 3) {
      iVar6 = Reflection::GetInt32(this_00,message,field);
LAB_0027b1ca:
      sVar17 = io::CodedOutputStream::VarintSize32SignExtended(iVar6);
      return sVar17;
    }
    sVar9 = 0;
    for (sVar10 = 0; sVar17 != sVar10; sVar10 = sVar10 + 1) {
      iVar6 = Reflection::GetRepeatedInt32(this_00,message,field,(int)sVar10);
      sVar14 = io::CodedOutputStream::VarintSize32SignExtended(iVar6);
      sVar9 = sVar9 + sVar14;
    }
    break;
  case TYPE_BOOL:
    break;
  case TYPE_STRING:
  case TYPE_BYTES:
    sVar9 = 0;
    for (sVar10 = 0; sVar17 != sVar10; sVar10 = sVar10 + 1) {
      iter.iter_ = &iter.key_;
      iter.map_ = (MapFieldBase *)0x0;
      iter.key_.val_.bool_value_ = false;
      if (*(int *)(field + 0x3c) == 3) {
        value = Reflection::GetRepeatedStringReference
                          (this_00,message,field,(int)sVar10,(string *)&iter);
      }
      else {
        value = Reflection::GetStringReference(this_00,message,field,(string *)&iter);
      }
      sVar14 = WireFormatLite::StringSize(value);
      sVar9 = sVar9 + sVar14;
      std::__cxx11::string::~string((string *)&iter);
    }
    break;
  case TYPE_GROUP:
    if (*(int *)(field + 0x3c) != 3) {
      pMVar15 = Reflection::GetMessage(this_00,message,field,(MessageFactory *)0x0);
      iVar3 = (*(pMVar15->super_MessageLite)._vptr_MessageLite[0xb])(pMVar15);
      return CONCAT44(extraout_var_00,iVar3);
    }
    sVar9 = 0;
    for (sVar10 = 0; sVar17 != sVar10; sVar10 = sVar10 + 1) {
      pMVar15 = Reflection::GetRepeatedMessage(this_00,message,field,(int)sVar10);
      iVar3 = (*(pMVar15->super_MessageLite)._vptr_MessageLite[0xb])(pMVar15);
      sVar9 = sVar9 + CONCAT44(extraout_var,iVar3);
    }
    break;
  case TYPE_MESSAGE:
    if (*(int *)(field + 0x3c) != 3) {
      pMVar15 = Reflection::GetMessage(this_00,message,field,(MessageFactory *)0x0);
      sVar17 = WireFormatLite::MessageSize<google::protobuf::Message>(pMVar15);
      return sVar17;
    }
    sVar9 = 0;
    for (sVar10 = 0; sVar17 != sVar10; sVar10 = sVar10 + 1) {
      pMVar15 = Reflection::GetRepeatedMessage(this_00,message,field,(int)sVar10);
      sVar14 = WireFormatLite::MessageSize<google::protobuf::Message>(pMVar15);
      sVar9 = sVar9 + sVar14;
    }
    break;
  case TYPE_UINT32:
    if (*(int *)(field + 0x3c) == 3) {
      sVar9 = 0;
      for (sVar10 = 0; sVar17 != sVar10; sVar10 = sVar10 + 1) {
        uVar7 = Reflection::GetRepeatedUInt32(this_00,message,field,(int)sVar10);
        iVar3 = 0x1f;
        if ((uVar7 | 1) != 0) {
          for (; (uVar7 | 1) >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        sVar9 = sVar9 + (iVar3 * 9 + 0x49U >> 6);
      }
      return sVar9;
    }
    uVar7 = Reflection::GetUInt32(this_00,message,field);
    iVar3 = 0x1f;
    if ((uVar7 | 1) != 0) {
      for (; (uVar7 | 1) >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    goto LAB_0027b1f3;
  case TYPE_ENUM:
    if (*(int *)(field + 0x3c) != 3) {
      pEVar12 = Reflection::GetEnum(this_00,message,field);
      iVar6 = *(int32 *)(pEVar12 + 0x10);
      goto LAB_0027b1ca;
    }
    sVar9 = 0;
    for (sVar10 = 0; sVar17 != sVar10; sVar10 = sVar10 + 1) {
      pEVar12 = Reflection::GetRepeatedEnum(this_00,message,field,(int)sVar10);
      sVar14 = io::CodedOutputStream::VarintSize32SignExtended(*(int32 *)(pEVar12 + 0x10));
      sVar9 = sVar9 + sVar14;
    }
    break;
  case TYPE_SINT32:
    if (*(int *)(field + 0x3c) != 3) {
      iVar6 = Reflection::GetInt32(this_00,message,field);
      sVar17 = WireFormatLite::SInt32Size(iVar6);
      return sVar17;
    }
    sVar9 = 0;
    for (sVar10 = 0; sVar17 != sVar10; sVar10 = sVar10 + 1) {
      iVar6 = Reflection::GetRepeatedInt32(this_00,message,field,(int)sVar10);
      sVar14 = WireFormatLite::SInt32Size(iVar6);
      sVar9 = sVar9 + sVar14;
    }
    break;
  case MAX_TYPE:
    if (*(int *)(field + 0x3c) != 3) {
      iVar13 = Reflection::GetInt64(this_00,message,field);
      sVar17 = WireFormatLite::SInt64Size(iVar13);
      return sVar17;
    }
    sVar9 = 0;
    for (sVar10 = 0; sVar17 != sVar10; sVar10 = sVar10 + 1) {
      iVar13 = Reflection::GetRepeatedInt64(this_00,message,field,(int)sVar10);
      sVar14 = WireFormatLite::SInt64Size(iVar13);
      sVar9 = sVar9 + sVar14;
    }
    break;
  default:
    sVar9 = 0;
  }
  return sVar9;
}

Assistant:

size_t WireFormat::FieldDataOnlyByteSize(const FieldDescriptor* field,
                                         const Message& message) {
  const Reflection* message_reflection = message.GetReflection();

  size_t data_size = 0;

  if (field->is_map()) {
    const MapFieldBase* map_field =
        message_reflection->GetMapData(message, field);
    if (map_field->IsMapValid()) {
      MapIterator iter(const_cast<Message*>(&message), field);
      MapIterator end(const_cast<Message*>(&message), field);
      const FieldDescriptor* key_field = field->message_type()->field(0);
      const FieldDescriptor* value_field = field->message_type()->field(1);
      for (map_field->MapBegin(&iter), map_field->MapEnd(&end); iter != end;
           ++iter) {
        size_t size = kMapEntryTagByteSize;
        size += MapKeyDataOnlyByteSize(key_field, iter.GetKey());
        size += MapValueRefDataOnlyByteSize(value_field, iter.GetValueRef());
        data_size += WireFormatLite::LengthDelimitedSize(size);
      }
      return data_size;
    }
  }

  size_t count = 0;
  if (field->is_repeated()) {
    count =
        internal::FromIntSize(message_reflection->FieldSize(message, field));
  } else if (field->containing_type()->options().map_entry()) {
    // Map entry fields always need to be serialized.
    count = 1;
  } else if (message_reflection->HasField(message, field)) {
    count = 1;
  }

  switch (field->type()) {
#define HANDLE_TYPE(TYPE, TYPE_METHOD, CPPTYPE_METHOD)                      \
  case FieldDescriptor::TYPE_##TYPE:                                        \
    if (field->is_repeated()) {                                             \
      for (int j = 0; j < count; j++) {                                     \
        data_size += WireFormatLite::TYPE_METHOD##Size(                     \
            message_reflection->GetRepeated##CPPTYPE_METHOD(message, field, \
                                                            j));            \
      }                                                                     \
    } else {                                                                \
      data_size += WireFormatLite::TYPE_METHOD##Size(                       \
          message_reflection->Get##CPPTYPE_METHOD(message, field));         \
    }                                                                       \
    break;

#define HANDLE_FIXED_TYPE(TYPE, TYPE_METHOD)                   \
  case FieldDescriptor::TYPE_##TYPE:                           \
    data_size += count * WireFormatLite::k##TYPE_METHOD##Size; \
    break;

    HANDLE_TYPE(INT32, Int32, Int32)
    HANDLE_TYPE(INT64, Int64, Int64)
    HANDLE_TYPE(SINT32, SInt32, Int32)
    HANDLE_TYPE(SINT64, SInt64, Int64)
    HANDLE_TYPE(UINT32, UInt32, UInt32)
    HANDLE_TYPE(UINT64, UInt64, UInt64)

    HANDLE_FIXED_TYPE(FIXED32, Fixed32)
    HANDLE_FIXED_TYPE(FIXED64, Fixed64)
    HANDLE_FIXED_TYPE(SFIXED32, SFixed32)
    HANDLE_FIXED_TYPE(SFIXED64, SFixed64)

    HANDLE_FIXED_TYPE(FLOAT, Float)
    HANDLE_FIXED_TYPE(DOUBLE, Double)

    HANDLE_FIXED_TYPE(BOOL, Bool)

    HANDLE_TYPE(GROUP, Group, Message)
    HANDLE_TYPE(MESSAGE, Message, Message)
#undef HANDLE_TYPE
#undef HANDLE_FIXED_TYPE

    case FieldDescriptor::TYPE_ENUM: {
      if (field->is_repeated()) {
        for (int j = 0; j < count; j++) {
          data_size += WireFormatLite::EnumSize(
              message_reflection->GetRepeatedEnum(message, field, j)->number());
        }
      } else {
        data_size += WireFormatLite::EnumSize(
            message_reflection->GetEnum(message, field)->number());
      }
      break;
    }

    // Handle strings separately so that we can get string references
    // instead of copying.
    case FieldDescriptor::TYPE_STRING:
    case FieldDescriptor::TYPE_BYTES: {
      for (int j = 0; j < count; j++) {
        std::string scratch;
        const std::string& value =
            field->is_repeated()
                ? message_reflection->GetRepeatedStringReference(message, field,
                                                                 j, &scratch)
                : message_reflection->GetStringReference(message, field,
                                                         &scratch);
        data_size += WireFormatLite::StringSize(value);
      }
      break;
    }
  }
  return data_size;
}